

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

int __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::select(index_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  size_t i;
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  size_t sVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  long lVar5;
  fd_set *pfVar6;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
  *this_00;
  supertype *psVar7;
  _func_int **pp_Var8;
  size_t i_00;
  uint in_stack_00000008;
  size_t local_48;
  fd_set *local_40;
  basic_path_node<char> *local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     __exceptfds);
  if (!bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  local_40 = __readfds;
  sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     __exceptfds);
  pfVar6 = local_40;
  i = this->index_;
  if ((long)i < (long)sVar3 && -1 < (long)i) {
    local_48 = i;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_38 = (basic_path_node<char> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,&local_38,&local_48);
    }
    pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)__exceptfds,i);
    psVar7 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar7 == (supertype *)0x0) {
      lVar5 = __timeout->tv_sec;
LAB_004521fd:
      iVar2 = (**(code **)(lVar5 + 0x10))(__timeout,__writefds,pbVar4);
      return iVar2;
    }
    pp_Var8 = psVar7->_vptr_jsonpath_selector;
    pfVar6 = local_40;
  }
  else {
    i_00 = sVar3 + i;
    if (-1 < (long)i || (long)i_00 < 0) {
      return (int)CONCAT71((int7)(sVar3 >> 8),(long)i_00 < 0);
    }
    local_48 = i_00;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_38 = (basic_path_node<char> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                             (this_00,&local_38,&local_48);
    }
    pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)__exceptfds,i_00);
    psVar7 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar7 == (supertype *)0x0) {
      lVar5 = __timeout->tv_sec;
      goto LAB_004521fd;
    }
    pp_Var8 = psVar7->_vptr_jsonpath_selector;
  }
  iVar2 = (*pp_Var8[2])(psVar7,this_00,pfVar6,__writefds,pbVar4,__timeout,in_stack_00000008);
  return iVar2;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), receiver, options);
                }
                else 
                {
                    int64_t index = slen + index_;
                    if (index >= 0 && index < slen)
                    {
                        auto i = static_cast<std::size_t>(index);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current.at(i), receiver, options);
                    }
                }
            }
        }